

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImDrawListSplitter::Merge(ImDrawListSplitter *this,ImDrawList *draw_list)

{
  ImDrawCmdHeader *pIVar1;
  ImDrawChannel *pIVar2;
  ImDrawChannel *pIVar3;
  undefined8 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  long lVar9;
  long lVar10;
  ImDrawCmd *pIVar11;
  unsigned_short *__dest;
  int iVar12;
  int iVar13;
  long lVar14;
  ImDrawCmd *pIVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  unsigned_short *puVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  if (1 < this->_Count) {
    SetCurrentChannel(this,draw_list,0);
    iVar18 = (draw_list->CmdBuffer).Size;
    lVar9 = (long)iVar18;
    if (lVar9 != 0) {
      pIVar15 = (draw_list->CmdBuffer).Data;
      if ((pIVar15[lVar9 + -1].ElemCount == 0) &&
         (pIVar15[lVar9 + -1].UserCallback == (ImDrawCallback)0x0)) {
        (draw_list->CmdBuffer).Size = iVar18 + -1;
      }
    }
    iVar18 = 0;
    if ((this->_Count < 1) || (lVar9 = (long)(draw_list->CmdBuffer).Size, lVar9 < 1)) {
      pIVar15 = (ImDrawCmd *)0x0;
    }
    else {
      pIVar15 = (draw_list->CmdBuffer).Data + lVar9 + -1;
    }
    if (pIVar15 != (ImDrawCmd *)0x0) {
      iVar18 = pIVar15->ElemCount + pIVar15->IdxOffset;
    }
    iVar13 = 0;
    iVar16 = 0;
    if (1 < this->_Count) {
      iVar16 = 0;
      lVar9 = 1;
      iVar13 = 0;
      do {
        pIVar2 = (this->_Channels).Data;
        pIVar3 = pIVar2 + lVar9;
        iVar12 = pIVar2[lVar9]._CmdBuffer.Size;
        if ((0 < (long)iVar12) && ((pIVar3->_CmdBuffer).Data[(long)iVar12 + -1].ElemCount == 0)) {
          (pIVar3->_CmdBuffer).Size = iVar12 + -1;
        }
        lVar10 = (long)(pIVar3->_CmdBuffer).Size;
        if ((0 < lVar10) && (pIVar15 != (ImDrawCmd *)0x0)) {
          pIVar11 = (pIVar3->_CmdBuffer).Data;
          auVar22[0] = -(*(char *)&(pIVar11->ClipRect).x == *(char *)&(pIVar15->ClipRect).x);
          auVar22[1] = -(*(char *)((long)&(pIVar11->ClipRect).x + 1) ==
                        *(char *)((long)&(pIVar15->ClipRect).x + 1));
          auVar22[2] = -(*(char *)((long)&(pIVar11->ClipRect).x + 2) ==
                        *(char *)((long)&(pIVar15->ClipRect).x + 2));
          auVar22[3] = -(*(char *)((long)&(pIVar11->ClipRect).x + 3) ==
                        *(char *)((long)&(pIVar15->ClipRect).x + 3));
          auVar22[4] = -(*(char *)&(pIVar11->ClipRect).y == *(char *)&(pIVar15->ClipRect).y);
          auVar22[5] = -(*(char *)((long)&(pIVar11->ClipRect).y + 1) ==
                        *(char *)((long)&(pIVar15->ClipRect).y + 1));
          auVar22[6] = -(*(char *)((long)&(pIVar11->ClipRect).y + 2) ==
                        *(char *)((long)&(pIVar15->ClipRect).y + 2));
          auVar22[7] = -(*(char *)((long)&(pIVar11->ClipRect).y + 3) ==
                        *(char *)((long)&(pIVar15->ClipRect).y + 3));
          auVar22[8] = -(*(char *)&(pIVar11->ClipRect).z == *(char *)&(pIVar15->ClipRect).z);
          auVar22[9] = -(*(char *)((long)&(pIVar11->ClipRect).z + 1) ==
                        *(char *)((long)&(pIVar15->ClipRect).z + 1));
          auVar22[10] = -(*(char *)((long)&(pIVar11->ClipRect).z + 2) ==
                         *(char *)((long)&(pIVar15->ClipRect).z + 2));
          auVar22[0xb] = -(*(char *)((long)&(pIVar11->ClipRect).z + 3) ==
                          *(char *)((long)&(pIVar15->ClipRect).z + 3));
          auVar22[0xc] = -(*(char *)&(pIVar11->ClipRect).w == *(char *)&(pIVar15->ClipRect).w);
          auVar22[0xd] = -(*(char *)((long)&(pIVar11->ClipRect).w + 1) ==
                          *(char *)((long)&(pIVar15->ClipRect).w + 1));
          auVar22[0xe] = -(*(char *)((long)&(pIVar11->ClipRect).w + 2) ==
                          *(char *)((long)&(pIVar15->ClipRect).w + 2));
          auVar22[0xf] = -(*(char *)((long)&(pIVar11->ClipRect).w + 3) ==
                          *(char *)((long)&(pIVar15->ClipRect).w + 3));
          auVar20[0] = -(*(char *)&(pIVar11->ClipRect).w == *(char *)&(pIVar15->ClipRect).w);
          auVar20[1] = -(*(char *)((long)&(pIVar11->ClipRect).w + 1) ==
                        *(char *)((long)&(pIVar15->ClipRect).w + 1));
          auVar20[2] = -(*(char *)((long)&(pIVar11->ClipRect).w + 2) ==
                        *(char *)((long)&(pIVar15->ClipRect).w + 2));
          auVar20[3] = -(*(char *)((long)&(pIVar11->ClipRect).w + 3) ==
                        *(char *)((long)&(pIVar15->ClipRect).w + 3));
          auVar20[4] = -(*(char *)&pIVar11->TextureId == *(char *)&pIVar15->TextureId);
          auVar20[5] = -(*(char *)((long)&pIVar11->TextureId + 1) ==
                        *(char *)((long)&pIVar15->TextureId + 1));
          auVar20[6] = -(*(char *)((long)&pIVar11->TextureId + 2) ==
                        *(char *)((long)&pIVar15->TextureId + 2));
          auVar20[7] = -(*(char *)((long)&pIVar11->TextureId + 3) ==
                        *(char *)((long)&pIVar15->TextureId + 3));
          auVar20[8] = -(*(char *)((long)&pIVar11->TextureId + 4) ==
                        *(char *)((long)&pIVar15->TextureId + 4));
          auVar20[9] = -(*(char *)((long)&pIVar11->TextureId + 5) ==
                        *(char *)((long)&pIVar15->TextureId + 5));
          auVar20[10] = -(*(char *)((long)&pIVar11->TextureId + 6) ==
                         *(char *)((long)&pIVar15->TextureId + 6));
          auVar20[0xb] = -(*(char *)((long)&pIVar11->TextureId + 7) ==
                          *(char *)((long)&pIVar15->TextureId + 7));
          auVar20[0xc] = -((char)pIVar11->VtxOffset == (char)pIVar15->VtxOffset);
          auVar20[0xd] = -(*(char *)((long)&pIVar11->VtxOffset + 1) ==
                          *(char *)((long)&pIVar15->VtxOffset + 1));
          auVar20[0xe] = -(*(char *)((long)&pIVar11->VtxOffset + 2) ==
                          *(char *)((long)&pIVar15->VtxOffset + 2));
          auVar20[0xf] = -(*(char *)((long)&pIVar11->VtxOffset + 3) ==
                          *(char *)((long)&pIVar15->VtxOffset + 3));
          auVar20 = auVar20 & auVar22;
          if (((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                       (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff) &&
             (pIVar11->UserCallback == (ImDrawCallback)0x0 &&
              pIVar15->UserCallback == (ImDrawCallback)0x0)) {
            pIVar15->ElemCount = pIVar15->ElemCount + pIVar11->ElemCount;
            iVar18 = iVar18 + pIVar11->ElemCount;
            memmove(pIVar11,pIVar11 + 1,lVar10 * 0x38 - 0x38);
            (pIVar3->_CmdBuffer).Size = (pIVar3->_CmdBuffer).Size + -1;
          }
        }
        iVar12 = (pIVar3->_CmdBuffer).Size;
        lVar10 = (long)iVar12;
        if (0 < lVar10) {
          pIVar15 = (pIVar3->_CmdBuffer).Data + lVar10 + -1;
        }
        iVar13 = iVar13 + (pIVar3->_IdxBuffer).Size;
        if (0 < iVar12) {
          pIVar11 = (pIVar3->_CmdBuffer).Data;
          lVar14 = 0;
          do {
            *(int *)((long)&pIVar11->IdxOffset + lVar14) = iVar18;
            iVar18 = iVar18 + *(int *)((long)&pIVar11->ElemCount + lVar14);
            lVar14 = lVar14 + 0x38;
          } while (lVar10 * 0x38 - lVar14 != 0);
        }
        iVar16 = iVar16 + iVar12;
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->_Count);
    }
    iVar12 = (draw_list->CmdBuffer).Size + iVar16;
    iVar18 = (draw_list->CmdBuffer).Capacity;
    if (iVar18 < iVar12) {
      if (iVar18 == 0) {
        iVar17 = 8;
      }
      else {
        iVar17 = iVar18 / 2 + iVar18;
      }
      if (iVar17 <= iVar12) {
        iVar17 = iVar12;
      }
      if (iVar18 < iVar17) {
        pIVar11 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar17 * 0x38);
        pIVar15 = (draw_list->CmdBuffer).Data;
        if (pIVar15 != (ImDrawCmd *)0x0) {
          memcpy(pIVar11,pIVar15,(long)(draw_list->CmdBuffer).Size * 0x38);
          ImGui::MemFree((draw_list->CmdBuffer).Data);
        }
        (draw_list->CmdBuffer).Data = pIVar11;
        (draw_list->CmdBuffer).Capacity = iVar17;
      }
    }
    (draw_list->CmdBuffer).Size = iVar12;
    lVar9 = (long)(draw_list->IdxBuffer).Size + (long)iVar13;
    iVar18 = (draw_list->IdxBuffer).Capacity;
    iVar12 = (int)lVar9;
    if (iVar18 < iVar12) {
      if (iVar18 == 0) {
        iVar17 = 8;
      }
      else {
        iVar17 = iVar18 / 2 + iVar18;
      }
      if (iVar17 <= iVar12) {
        iVar17 = iVar12;
      }
      if (iVar18 < iVar17) {
        __dest = (unsigned_short *)ImGui::MemAlloc((long)iVar17 * 2);
        puVar19 = (draw_list->IdxBuffer).Data;
        if (puVar19 != (unsigned_short *)0x0) {
          memcpy(__dest,puVar19,(long)(draw_list->IdxBuffer).Size * 2);
          ImGui::MemFree((draw_list->IdxBuffer).Data);
        }
        (draw_list->IdxBuffer).Data = __dest;
        (draw_list->IdxBuffer).Capacity = iVar17;
      }
    }
    (draw_list->IdxBuffer).Size = iVar12;
    puVar19 = (draw_list->IdxBuffer).Data + (lVar9 - iVar13);
    if (1 < this->_Count) {
      pIVar15 = (draw_list->CmdBuffer).Data + ((long)(draw_list->CmdBuffer).Size - (long)iVar16);
      lVar9 = 1;
      lVar10 = 0x38;
      do {
        pIVar3 = (this->_Channels).Data;
        lVar14 = (long)*(int *)((long)pIVar3 + lVar10 + -0x18);
        if (lVar14 != 0) {
          memcpy(pIVar15,*(void **)((long)pIVar3 + lVar10 + -0x10),lVar14 * 0x38);
          pIVar15 = pIVar15 + lVar14;
        }
        lVar14 = (long)*(int *)((long)pIVar3 + lVar10 + -8);
        if (lVar14 != 0) {
          memcpy(puVar19,*(void **)((long)&(pIVar3->_CmdBuffer).Size + lVar10),lVar14 * 2);
          puVar19 = puVar19 + lVar14;
        }
        lVar9 = lVar9 + 1;
        lVar10 = lVar10 + 0x20;
      } while (lVar9 < this->_Count);
    }
    draw_list->_IdxWritePtr = puVar19;
    lVar9 = (long)(draw_list->CmdBuffer).Size;
    if ((lVar9 == 0) ||
       ((draw_list->CmdBuffer).Data[lVar9 + -1].UserCallback != (ImDrawCallback)0x0)) {
      ImDrawList::AddDrawCmd(draw_list);
    }
    pIVar15 = (draw_list->CmdBuffer).Data;
    iVar18 = (draw_list->CmdBuffer).Size;
    pIVar11 = pIVar15 + (long)iVar18 + -1;
    pIVar1 = &draw_list->_CmdHeader;
    if (pIVar15[(long)iVar18 + -1].ElemCount == 0) {
      fVar5 = (pIVar1->ClipRect).x;
      fVar6 = (pIVar1->ClipRect).y;
      fVar7 = (draw_list->_CmdHeader).ClipRect.z;
      fVar8 = (draw_list->_CmdHeader).ClipRect.w;
      uVar4 = *(undefined8 *)((long)&(draw_list->_CmdHeader).TextureId + 4);
      *(undefined8 *)&pIVar15[(long)iVar18 + -1].ClipRect.w =
           *(undefined8 *)&(draw_list->_CmdHeader).ClipRect.w;
      *(undefined8 *)((long)&pIVar15[(long)iVar18 + -1].TextureId + 4) = uVar4;
      (pIVar11->ClipRect).x = fVar5;
      (pIVar11->ClipRect).y = fVar6;
      pIVar15[(long)iVar18 + -1].ClipRect.z = fVar7;
      pIVar15[(long)iVar18 + -1].ClipRect.w = fVar8;
    }
    else {
      auVar23[0] = -(*(char *)&(pIVar1->ClipRect).x == *(char *)&(pIVar11->ClipRect).x);
      auVar23[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 1) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.x + 1));
      auVar23[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 2) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.x + 2));
      auVar23[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.x + 3) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.x + 3));
      auVar23[4] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.y ==
                    *(char *)&pIVar15[(long)iVar18 + -1].ClipRect.y);
      auVar23[5] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 1) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.y + 1));
      auVar23[6] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 2) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.y + 2));
      auVar23[7] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.y + 3) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.y + 3));
      auVar23[8] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.z ==
                    *(char *)&pIVar15[(long)iVar18 + -1].ClipRect.z);
      auVar23[9] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 1) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.z + 1));
      auVar23[10] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 2) ==
                     *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.z + 2));
      auVar23[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.z + 3) ==
                      *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.z + 3));
      auVar23[0xc] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                      *(char *)&pIVar15[(long)iVar18 + -1].ClipRect.w);
      auVar23[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                      *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.w + 1));
      auVar23[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                      *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.w + 2));
      auVar23[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                      *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.w + 3));
      auVar21[0] = -(*(char *)&(draw_list->_CmdHeader).ClipRect.w ==
                    *(char *)&pIVar15[(long)iVar18 + -1].ClipRect.w);
      auVar21[1] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 1) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.w + 1));
      auVar21[2] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 2) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.w + 2));
      auVar21[3] = -(*(char *)((long)&(draw_list->_CmdHeader).ClipRect.w + 3) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].ClipRect.w + 3));
      auVar21[4] = -(*(char *)&(draw_list->_CmdHeader).TextureId ==
                    *(char *)&pIVar15[(long)iVar18 + -1].TextureId);
      auVar21[5] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 1) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].TextureId + 1));
      auVar21[6] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 2) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].TextureId + 2));
      auVar21[7] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 3) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].TextureId + 3));
      auVar21[8] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 4) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].TextureId + 4));
      auVar21[9] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 5) ==
                    *(char *)((long)&pIVar15[(long)iVar18 + -1].TextureId + 5));
      auVar21[10] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 6) ==
                     *(char *)((long)&pIVar15[(long)iVar18 + -1].TextureId + 6));
      auVar21[0xb] = -(*(char *)((long)&(draw_list->_CmdHeader).TextureId + 7) ==
                      *(char *)((long)&pIVar15[(long)iVar18 + -1].TextureId + 7));
      auVar21[0xc] = -((char)(draw_list->_CmdHeader).VtxOffset ==
                      (char)pIVar15[(long)iVar18 + -1].VtxOffset);
      auVar21[0xd] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 1) ==
                      *(char *)((long)&pIVar15[(long)iVar18 + -1].VtxOffset + 1));
      auVar21[0xe] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 2) ==
                      *(char *)((long)&pIVar15[(long)iVar18 + -1].VtxOffset + 2));
      auVar21[0xf] = -(*(char *)((long)&(draw_list->_CmdHeader).VtxOffset + 3) ==
                      *(char *)((long)&pIVar15[(long)iVar18 + -1].VtxOffset + 3));
      auVar21 = auVar21 & auVar23;
      if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) {
        ImDrawList::AddDrawCmd(draw_list);
      }
    }
    this->_Count = 1;
  }
  return;
}

Assistant:

void ImDrawListSplitter::Merge(ImDrawList* draw_list)
{
    // Note that we never use or rely on _Channels.Size because it is merely a buffer that we never shrink back to 0 to keep all sub-buffers ready for use.
    if (_Count <= 1)
        return;

    SetCurrentChannel(draw_list, 0);
    draw_list->_PopUnusedDrawCmd();

    // Calculate our final buffer sizes. Also fix the incorrect IdxOffset values in each command.
    int new_cmd_buffer_count = 0;
    int new_idx_buffer_count = 0;
    ImDrawCmd* last_cmd = (_Count > 0 && draw_list->CmdBuffer.Size > 0) ? &draw_list->CmdBuffer.back() : NULL;
    int idx_offset = last_cmd ? last_cmd->IdxOffset + last_cmd->ElemCount : 0;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];

        // Equivalent of PopUnusedDrawCmd() for this channel's cmdbuffer and except we don't need to test for UserCallback.
        if (ch._CmdBuffer.Size > 0 && ch._CmdBuffer.back().ElemCount == 0)
            ch._CmdBuffer.pop_back();

        if (ch._CmdBuffer.Size > 0 && last_cmd != NULL)
        {
            ImDrawCmd* next_cmd = &ch._CmdBuffer[0];
            if (ImDrawCmd_HeaderCompare(last_cmd, next_cmd) == 0 && last_cmd->UserCallback == NULL && next_cmd->UserCallback == NULL)
            {
                // Merge previous channel last draw command with current channel first draw command if matching.
                last_cmd->ElemCount += next_cmd->ElemCount;
                idx_offset += next_cmd->ElemCount;
                ch._CmdBuffer.erase(ch._CmdBuffer.Data); // FIXME-OPT: Improve for multiple merges.
            }
        }
        if (ch._CmdBuffer.Size > 0)
            last_cmd = &ch._CmdBuffer.back();
        new_cmd_buffer_count += ch._CmdBuffer.Size;
        new_idx_buffer_count += ch._IdxBuffer.Size;
        for (int cmd_n = 0; cmd_n < ch._CmdBuffer.Size; cmd_n++)
        {
            ch._CmdBuffer.Data[cmd_n].IdxOffset = idx_offset;
            idx_offset += ch._CmdBuffer.Data[cmd_n].ElemCount;
        }
    }
    draw_list->CmdBuffer.resize(draw_list->CmdBuffer.Size + new_cmd_buffer_count);
    draw_list->IdxBuffer.resize(draw_list->IdxBuffer.Size + new_idx_buffer_count);

    // Write commands and indices in order (they are fairly small structures, we don't copy vertices only indices)
    ImDrawCmd* cmd_write = draw_list->CmdBuffer.Data + draw_list->CmdBuffer.Size - new_cmd_buffer_count;
    ImDrawIdx* idx_write = draw_list->IdxBuffer.Data + draw_list->IdxBuffer.Size - new_idx_buffer_count;
    for (int i = 1; i < _Count; i++)
    {
        ImDrawChannel& ch = _Channels[i];
        if (int sz = ch._CmdBuffer.Size) { memcpy(cmd_write, ch._CmdBuffer.Data, sz * sizeof(ImDrawCmd)); cmd_write += sz; }
        if (int sz = ch._IdxBuffer.Size) { memcpy(idx_write, ch._IdxBuffer.Data, sz * sizeof(ImDrawIdx)); idx_write += sz; }
    }
    draw_list->_IdxWritePtr = idx_write;

    // Ensure there's always a non-callback draw command trailing the command-buffer
    if (draw_list->CmdBuffer.Size == 0 || draw_list->CmdBuffer.back().UserCallback != NULL)
        draw_list->AddDrawCmd();

    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &draw_list->CmdBuffer.Data[draw_list->CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount == 0)
        ImDrawCmd_HeaderCopy(curr_cmd, &draw_list->_CmdHeader); // Copy ClipRect, TextureId, VtxOffset
    else if (ImDrawCmd_HeaderCompare(curr_cmd, &draw_list->_CmdHeader) != 0)
        draw_list->AddDrawCmd();

    _Count = 1;
}